

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

ON_3dPoint * __thiscall ON_Line::PointAt(ON_3dPoint *__return_storage_ptr__,ON_Line *this,double t)

{
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  ON_3dVector local_30;
  double local_18;
  double t_local;
  ON_Line *this_local;
  
  local_18 = t;
  t_local = (double)this;
  if (0.5 <= t) {
    ON_3dPoint::operator-(&local_78,&this->from,&this->to);
    ::operator*(&local_60,1.0 - t,&local_78);
    ON_3dPoint::operator+(__return_storage_ptr__,&this->to,&local_60);
  }
  else {
    ON_3dPoint::operator-(&local_48,&this->to,&this->from);
    ::operator*(&local_30,t,&local_48);
    ON_3dPoint::operator+(__return_storage_ptr__,&this->from,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_Line::PointAt( double t ) const
{
  // 26 Feb 2003 Dale Lear
  //     Changed 
  //          return (1-t)*from + t*to;
  //     to the following so that axis aligned lines will
  //     return exact answers for large values of t.  
  //     See RR 9683.
 

  //08 May 2022 - Greg. Mikko, Chuck.  This is more accurate than the parameterwise 
  //(1-t)*from + t*to with fudging.  Note that if any coordinate of from is the same as that of to,
  //the answer will be exact in that coord.
  return  (t < 0.5) ? from + t*(to-from) : to + (1.0-t)*(from-to);
}